

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O0

int ecx_srconfirm(ecx_portt *port,int idx,int timeout)

{
  boolean bVar1;
  uint uVar2;
  bool bVar3;
  osal_timert local_2c;
  osal_timert timer2;
  osal_timert timer1;
  int wkc;
  int timeout_local;
  int idx_local;
  ecx_portt *port_local;
  
  osal_timer_start(&timer2,timeout);
  do {
    ecx_outframe_red(port,idx);
    if (timeout < 2000) {
      osal_timer_start(&local_2c,timeout);
    }
    else {
      osal_timer_start(&local_2c,2000);
    }
    uVar2 = ecx_waitinframe_red(port,idx,&local_2c);
    bVar3 = false;
    if (0x7fffffff < uVar2) {
      bVar1 = osal_timer_is_expired(&timer2);
      bVar3 = bVar1 == '\0';
    }
  } while (bVar3);
  if (0x7fffffff < uVar2) {
    ecx_setbufstat(port,idx,0);
  }
  return uVar2;
}

Assistant:

int ecx_srconfirm(ecx_portt *port, int idx, int timeout)
{
   int wkc = EC_NOFRAME;
   osal_timert timer1, timer2;

   osal_timer_start (&timer1, timeout);
   do 
   {
      /* tx frame on primary and if in redundant mode a dummy on secondary */
      ecx_outframe_red(port, idx);
      if (timeout < EC_TIMEOUTRET) 
      {
         osal_timer_start (&timer2, timeout); 
      }
      else 
      {
         /* normally use partial timout for rx */
         osal_timer_start (&timer2, EC_TIMEOUTRET); 
      }
      /* get frame from primary or if in redundant mode possibly from secondary */
      wkc = ecx_waitinframe_red(port, idx, &timer2);
   /* wait for answer with WKC>=0 or otherwise retry until timeout */   
   } while ((wkc <= EC_NOFRAME) && !osal_timer_is_expired (&timer1));
   /* if nothing received, clear buffer index status so it can be used again */
   if (wkc <= EC_NOFRAME) 
   {
      ecx_setbufstat(port, idx, EC_BUF_EMPTY);
   }
   
   return wkc;
}